

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::Init(TextbookBoyerMooreSetup<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_1c;
  uint local_18;
  uint j;
  CharCount i_1;
  uint i;
  TextbookBoyerMooreSetup<char16_t> *this_local;
  
  if (this->patLen == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xc,"(patLen > 0)","patLen > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  for (j = 0; j < 4; j = j + 1) {
    this->lastOcc[j] = -1;
  }
  this->numLinearChars = 1;
  this->linearChar[0] = this->pat[this->patLen - 1];
  for (local_18 = 0; local_18 < this->patLen; local_18 = local_18 + 1) {
    if (this->numLinearChars < 5) {
      for (local_1c = 0; local_1c < this->numLinearChars; local_1c = local_1c + 1) {
        if (this->linearChar[local_1c] == this->pat[local_18]) {
          this->lastOcc[local_1c] = local_18;
          break;
        }
      }
      if (local_1c == this->numLinearChars) {
        if (this->numLinearChars < 4) {
          this->linearChar[this->numLinearChars] = this->pat[local_18];
          this->lastOcc[this->numLinearChars] = local_18;
        }
        this->numLinearChars = this->numLinearChars + 1;
      }
    }
    if (4 < this->numLinearChars) break;
  }
  if (this->numLinearChars < 5) {
    this->scheme = LinearScheme;
  }
  else {
    this->scheme = DefaultScheme;
  }
  return;
}

Assistant:

void TextbookBoyerMooreSetup<C>::Init()
    {
        Assert(patLen > 0);
        for (uint i = 0; i < MaxCharMapLinearChars; i++)
        {
            lastOcc[i] = -1;
        }

        numLinearChars = 1;

        // Always put the last character in the first index
        linearChar[0] = pat[patLen - 1];
        for (CharCount i = 0; i < patLen; i++)
        {
            if (numLinearChars <= MaxCharMapLinearChars)
            {
                uint j = 0;
                for (; j < numLinearChars; j++)
                {
                    if (linearChar[j] == pat[i])
                    {
                        lastOcc[j] = i;
                        break;
                    }
                }
                if (j == numLinearChars)
                {
                    if (numLinearChars < MaxCharMapLinearChars)
                    {
                        linearChar[numLinearChars] = pat[i];
                        lastOcc[numLinearChars] = i;
                    }
                    numLinearChars++;
                }
            }

            if (numLinearChars > MaxCharMapLinearChars)
            {
                break;
            }
        }
        if (numLinearChars <= MaxCharMapLinearChars)
        {
            scheme = LinearScheme;
        }
        else
        {
            scheme = DefaultScheme;
        }
    }